

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

type fmt::v5::
     visit_format_arg<fmt::v5::internal::arg_converter<signed_char,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
               (arg_converter<signed_char,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
                *vis,basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
                     *arg)

{
  int iVar1;
  int iVar2;
  basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
  *pbVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  type tVar7;
  
  switch(arg->type_) {
  case int_type:
  case uint_type:
  case char_type:
    bVar4 = *(byte *)&(arg->value_).field_0;
    uVar6 = (ulong)bVar4;
    if ((vis->type_ == 0x69) || (vis->type_ == 100)) {
LAB_0013fcbf:
      uVar5 = (uint)(char)bVar4;
      goto LAB_0013fcc2;
    }
    break;
  case long_long_type:
  case ulong_long_type:
    uVar6 = (arg->value_).field_0.ulong_long_value;
    bVar4 = (byte)uVar6;
    if ((vis->type_ == 0x69) || (vis->type_ == 100)) goto LAB_0013fcbf;
    uVar6 = uVar6 & 0xff;
    break;
  case bool_type:
    iVar1 = (arg->value_).field_0.int_value;
    iVar2 = vis->type_;
    if (iVar2 != 100) {
      if (iVar2 == 0x73) {
        return;
      }
      if (iVar2 != 0x69) {
        uVar6 = (ulong)(iVar1 != 0);
        break;
      }
    }
    uVar5 = (uint)(iVar1 != 0);
LAB_0013fcc2:
    uVar6 = (ulong)uVar5;
    tVar7 = int_type;
    goto LAB_0013fcf7;
  default:
    goto switchD_0013fc9b_default;
  }
  tVar7 = uint_type;
LAB_0013fcf7:
  pbVar3 = vis->arg_;
  *(ulong *)&(pbVar3->value_).field_0 = uVar6;
  pbVar3->type_ = tVar7;
switchD_0013fc9b_default:
  return;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}